

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

void nh_http_parse_get_body_len(http_context_t *ctx)

{
  uint32_t uVar1;
  http_string_t string;
  
  string = get_request_header(ctx,"Content-Length");
  if (string.len == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = nh_string_to_uint(string);
  }
  ctx->body_len = uVar1;
  return;
}

Assistant:

void nh_http_parse_get_body_len(http_context_t *ctx) {
    http_string_t length_str = get_request_header(ctx, "Content-Length");
    if (length_str.len == 0) {
        ctx->body_len = 0;
    } else {
        uint32_t length = nh_string_to_uint(length_str);
        ctx->body_len = length > 0 ? length : 0;
    }
}